

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_RH_POINT
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  ON_OBSOLETE_V2_AnnotationArrow *this_00;
  ON_OBSOLETE_V2_TextDot *this_01;
  ON_Point *pOVar4;
  ON_3DM_BIG_CHUNK *pOVar5;
  ulong local_118;
  ON__UINT64 chunk_length;
  ON__UINT64 pos1;
  ON_OBSOLETE_V2_TextDot *dot;
  double local_a0;
  double local_98;
  ON_OBSOLETE_V2_AnnotationArrow *local_90;
  ON_OBSOLETE_V2_AnnotationArrow *arrow;
  undefined1 local_78 [8];
  ON__3dmV1_XDATA xdata;
  ON_3dPoint pt;
  bool bHaveMat;
  ON_3DM_BIG_CHUNK *pOStack_30;
  bool rc;
  ON_3DM_BIG_CHUNK *point_chunk;
  ON__UINT64 pos0;
  ON_3dmObjectAttributes *pAttributes_local;
  ON_Object **ppObject_local;
  ON_BinaryArchive *this_local;
  
  point_chunk = (ON_3DM_BIG_CHUNK *)0x0;
  pOStack_30 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
  if (((pOStack_30 == (ON_3DM_BIG_CHUNK *)0x0) || (pOStack_30->m_typecode != 0x100001)) ||
     (pOStack_30->m_big_value != 0)) {
    pOStack_30 = (ON_3DM_BIG_CHUNK *)0x0;
  }
  else {
    point_chunk = (ON_3DM_BIG_CHUNK *)CurrentPosition(this);
  }
  pt.z._7_1_ = 0;
  pt.z._6_1_ = 0;
  ON__3dmV1_XDATA::ON__3dmV1_XDATA((ON__3dmV1_XDATA *)local_78);
  pt.z._7_1_ = ReadPoint(this,(ON_3dPoint *)&xdata.m_vector.z);
  if ((bool)pt.z._7_1_) {
    pt.z._7_1_ = Read3dmV1AttributesOrMaterial
                           (this,pAttributes,(ON_Material *)0x0,(bool *)((long)&pt.z + 6),0xffffffff
                            ,(ON__3dmV1_XDATA *)local_78);
    if (local_78._0_4_ == arrow_direction) {
      dVar1 = ON_3dVector::Length((ON_3dVector *)&xdata.m_string);
      if (dVar1 <= 2.3283064365386963e-10) {
        pOVar4 = (ON_Point *)operator_new(0x28);
        ON_Point::ON_Point(pOVar4,(ON_3dPoint *)&xdata.m_vector.z);
        *ppObject = (ON_Object *)pOVar4;
      }
      else {
        this_00 = (ON_OBSOLETE_V2_AnnotationArrow *)operator_new(0x40);
        ON_OBSOLETE_V2_AnnotationArrow::ON_OBSOLETE_V2_AnnotationArrow(this_00);
        (this_00->m_tail).z = pt.y;
        (this_00->m_tail).x = xdata.m_vector.z;
        (this_00->m_tail).y = pt.x;
        local_90 = this_00;
        ON_3dPoint::operator+
                  ((ON_3dPoint *)&dot,(ON_3dPoint *)&xdata.m_vector.z,(ON_3dVector *)&xdata.m_string
                  );
        (local_90->m_head).x = (double)dot;
        (local_90->m_head).y = local_a0;
        (local_90->m_head).z = local_98;
        *ppObject = (ON_Object *)local_90;
      }
    }
    else if (local_78._0_4_ == dot_text) {
      this_01 = (ON_OBSOLETE_V2_TextDot *)operator_new(0x30);
      ON_OBSOLETE_V2_TextDot::ON_OBSOLETE_V2_TextDot(this_01);
      (this_01->super_ON_Point).point.z = pt.y;
      (this_01->super_ON_Point).point.x = xdata.m_vector.z;
      (this_01->super_ON_Point).point.y = pt.x;
      ON_wString::operator=(&this_01->m_text,(ON_String *)&xdata);
      bVar3 = ON_wString::IsEmpty(&this_01->m_text);
      if (bVar3) {
        ON_wString::operator=(&this_01->m_text," ");
      }
      *ppObject = (ON_Object *)this_01;
    }
    else {
      pOVar4 = (ON_Point *)operator_new(0x28);
      ON_Point::ON_Point(pOVar4,(ON_3dPoint *)&xdata.m_vector.z);
      *ppObject = (ON_Object *)pOVar4;
    }
  }
  if (((((pt.z._7_1_ & 1) != 0) && (point_chunk != (ON_3DM_BIG_CHUNK *)0x0)) &&
      ((pOStack_30 != (ON_3DM_BIG_CHUNK *)0x0 &&
       ((pOVar5 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk), pOStack_30 == pOVar5 &&
        (pOStack_30->m_typecode == 0x100001)))))) && (pOStack_30->m_big_value == 0)) {
    pOVar5 = (ON_3DM_BIG_CHUNK *)CurrentPosition(this);
    if (point_chunk < pOVar5) {
      local_118 = (long)pOVar5 - (long)point_chunk;
    }
    else {
      local_118 = 0;
    }
    if ((0x1f < local_118) && (local_118 < 0xfffffff)) {
      pOStack_30->m_big_value = local_118;
    }
  }
  bVar2 = pt.z._7_1_;
  ON__3dmV1_XDATA::~ON__3dmV1_XDATA((ON__3dmV1_XDATA *)local_78);
  return (bool)(bVar2 & 1);
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_RH_POINT(
  ON_Object** ppObject,
  ON_3dmObjectAttributes* pAttributes
  )
{
  ON__UINT64 pos0 = 0;
  ON_3DM_BIG_CHUNK* point_chunk = m_chunk.Last();

  if (    0 != point_chunk 
       && TCODE_RH_POINT == point_chunk->m_typecode 
       && 0 == point_chunk->m_big_value )
  {
    // Some early V1 files have TCODE_RH_POINT chunks with arrow xdata
    // attached have a length set to zero.
    // For these chunks we need to set the chunk length so EndRead3dmChunk()
    // will keep going.
    pos0 = CurrentPosition();
  }
  else
    point_chunk = 0;

  // read v1 point
  bool rc = false;
  bool bHaveMat = false;
  ON_3dPoint pt;
  ON__3dmV1_XDATA xdata;
  rc = ReadPoint(pt);
  if (rc) 
  {
    rc = Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_ENDOFTABLE,&xdata);
    // do switch even if Read3dmV1AttributesOrMaterial() fails
    switch ( xdata.m_type )
    {
    case ON__3dmV1_XDATA::arrow_direction:
      if ( xdata.m_vector.Length() > ON_ZERO_TOLERANCE )
      {
        ON_OBSOLETE_V2_AnnotationArrow* arrow = new ON_OBSOLETE_V2_AnnotationArrow();
        arrow->m_tail = pt;
        arrow->m_head = pt + xdata.m_vector;
        *ppObject = arrow;
      }
      else
      {
        *ppObject = new ON_Point(pt);
      }
      break;

    case ON__3dmV1_XDATA::dot_text:
      {
        ON_OBSOLETE_V2_TextDot* dot = new ON_OBSOLETE_V2_TextDot();
        dot->point = pt;
        dot->m_text = xdata.m_string;
        if ( dot->m_text.IsEmpty() )
          dot->m_text = " "; // a single blank
        *ppObject = dot;
      }
      break;

    default:
      *ppObject = new ON_Point(pt);
      break;
    }
  }

  // carefully test for the V1 zero length chunk bug
  if ( rc && pos0 > 0 && 0 != point_chunk && point_chunk == m_chunk.Last() )
  {
    if ( TCODE_RH_POINT == point_chunk->m_typecode && 0 == point_chunk->m_big_value )
    {
      // This TCODE_RH_POINT chunk has the zero length chunk bug
      // that was in some V1 files. 
      // Fill in the correct chunk length so that reading can continue.
      ON__UINT64 pos1 = CurrentPosition();
      ON__UINT64 chunk_length = (pos1 > pos0) ? (pos1 - pos0) : 0;
      if ( chunk_length >= 32 && chunk_length < 0x0FFFFFFF )
        point_chunk->m_big_value = (ON__INT64)chunk_length;
    }
  }

  return rc;
}